

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

void xmlFreeCatalog(xmlCatalogPtr catal)

{
  if (catal != (xmlCatalogPtr)0x0) {
    if (catal->xml != (xmlCatalogEntryPtr)0x0) {
      xmlFreeCatalogEntryList(catal->xml);
    }
    if (catal->sgml != (xmlHashTablePtr)0x0) {
      xmlHashFree(catal->sgml,xmlFreeCatalogEntry);
    }
    (*xmlFree)(catal);
    return;
  }
  return;
}

Assistant:

void
xmlFreeCatalog(xmlCatalogPtr catal) {
    if (catal == NULL)
	return;
    if (catal->xml != NULL)
	xmlFreeCatalogEntryList(catal->xml);
    if (catal->sgml != NULL)
	xmlHashFree(catal->sgml, xmlFreeCatalogEntry);
    xmlFree(catal);
}